

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_spalding_uplus(REF_DBL yplus,REF_DBL *uplus)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  REF_DBL RVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  RVar5 = yplus;
  if (12.0 < yplus) {
    dVar4 = log(yplus / 0.1108);
    RVar5 = dVar4 / 0.4;
  }
  bVar3 = true;
  iVar1 = 100;
  do {
    if (!bVar3) {
      *uplus = RVar5;
      return 0;
    }
    dVar4 = exp(RVar5 * 0.4);
    dVar8 = (RVar5 * -0.4 + dVar4 + -1.0) * 0.1108 + RVar5;
    dVar6 = dVar8 - yplus;
    dVar4 = exp(RVar5 * 0.4);
    dVar9 = (dVar4 * 0.4 + -0.4) * 0.1108 + 1.0;
    dVar4 = dVar8 * 1e+20;
    if (dVar4 <= -dVar4) {
      dVar4 = -dVar4;
    }
    dVar7 = dVar6;
    if (dVar6 <= -dVar6) {
      dVar7 = -dVar6;
    }
    if (dVar4 <= dVar7) {
LAB_001a8679:
      bVar3 = dVar7 == 1e-15;
      bVar2 = dVar7 < 1e-15;
    }
    else {
      dVar4 = dVar8;
      if (dVar8 <= -dVar8) {
        dVar4 = -dVar8;
      }
      if (dVar4 <= 0.001) goto LAB_001a8679;
      dVar4 = dVar6 / dVar8;
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      bVar3 = dVar4 == 1e-12;
      bVar2 = dVar4 < 1e-12;
    }
    bVar3 = !bVar2 && !bVar3;
    RVar5 = RVar5 - dVar6 / dVar9;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2a4,
             "ref_phys_spalding_uplus","iteration count exceeded");
      printf(" y %e u %e err %e dydu %e\n",dVar8,RVar5,dVar6,dVar9);
      return 1;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_phys_spalding_uplus(REF_DBL yplus, REF_DBL *uplus) {
  REF_DBL u, y, error, dyplus_duplus;
  REF_BOOL keep_going;
  REF_INT iters;
  u = yplus;
  if (u > 12) u = log(yplus / 0.1108) / 0.4;

  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    RSS(ref_phys_spalding_yplus(u, &y), "yplus");
    error = y - yplus;

    RSS(ref_phys_spalding_dyplus_duplus(u, &dyplus_duplus), "dyplus");

    u = u - error / dyplus_duplus;

    if (ref_math_divisible(error, y) && ABS(y) > 1.0e-3) {
      keep_going = (ABS(error / y) > 1.0e-12);
    } else {
      keep_going = (ABS(error) > 1.0e-15);
    }

    iters++;
    RAB(iters < 100, "iteration count exceeded",
        { printf(" y %e u %e err %e dydu %e\n", y, u, error, dyplus_duplus); });
  }

  *uplus = u;

  return REF_SUCCESS;
}